

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_product(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  double dVar1;
  uint uVar2;
  sxu32 sVar3;
  long lVar4;
  jx9_value *pjVar5;
  uint uVar6;
  uint uVar7;
  jx9_hashmap_node *pNode;
  long iValue;
  bool bVar8;
  double local_40;
  sxi64 nv;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 0x40) != 0)) {
    lVar4 = ((*apArg)->x).iVal;
    uVar6 = *(uint *)(lVar4 + 0x2c);
    if (uVar6 != 0) {
      pNode = *(jx9_hashmap_node **)(lVar4 + 0x10);
      pjVar5 = HashmapExtractNodeValue(pNode);
      if (pjVar5 != (jx9_value *)0x0) {
        if ((pjVar5->iFlags & 4) == 0) {
          iValue = 1;
          for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
            pjVar5 = HashmapExtractNodeValue(pNode);
            if (pjVar5 != (jx9_value *)0x0) {
              uVar2 = pjVar5->iFlags;
              if ((uVar2 & 0x160) == 0) {
                if ((uVar2 & 4) == 0) {
                  if ((uVar2 & 10) == 0) {
                    if (((uVar2 & 1) != 0) && (sVar3 = (pjVar5->sBlob).nByte, sVar3 != 0)) {
                      nv = 0;
                      SyStrToInt64((char *)(pjVar5->sBlob).pBlob,sVar3,&nv,(char **)(ulong)uVar2);
                      iValue = iValue * nv;
                      uVar6 = *(uint *)(lVar4 + 0x2c);
                    }
                  }
                  else {
                    iValue = iValue * (pjVar5->x).iVal;
                  }
                }
                else {
                  iValue = iValue * (long)(pjVar5->x).rVal;
                }
              }
            }
            pNode = pNode->pPrev;
          }
          jx9_result_int64(pCtx,iValue);
          return 0;
        }
        local_40 = 1.0;
        do {
          bVar8 = uVar6 == 0;
          uVar6 = uVar6 - 1;
          if (bVar8) {
            jx9_result_double(pCtx,local_40);
            return 0;
          }
          pjVar5 = HashmapExtractNodeValue(pNode);
          if (pjVar5 != (jx9_value *)0x0) {
            uVar7 = pjVar5->iFlags;
            if ((uVar7 & 0x160) == 0) {
              if ((uVar7 & 4) == 0) {
                if ((uVar7 & 10) == 0) {
                  if (((uVar7 & 1) != 0) && (sVar3 = (pjVar5->sBlob).nByte, sVar3 != 0)) {
                    nv = 0;
                    SyStrToReal((char *)(pjVar5->sBlob).pBlob,sVar3,&nv,(char **)(ulong)uVar7);
                    dVar1 = (double)nv;
                    goto LAB_00131b7c;
                  }
                }
                else {
                  local_40 = local_40 * (double)(pjVar5->x).iVal;
                }
              }
              else {
                dVar1 = (pjVar5->x).rVal;
LAB_00131b7c:
                local_40 = local_40 * dVar1;
              }
            }
          }
          pNode = pNode->pPrev;
        } while( true );
      }
    }
  }
  jx9_result_int(pCtx,0);
  return 0;
}

Assistant:

static int jx9_hashmap_product(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	jx9_value *pObj;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Nothing to compute, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* If the first element is of type float, then perform floating
	 * point computaion.Otherwise switch to int64 computaion.
	 */
	pObj = HashmapExtractNodeValue(pMap->pFirst);
	if( pObj == 0 ){
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( pObj->iFlags & MEMOBJ_REAL ){
		DoubleProd(pCtx, pMap);
	}else{
		Int64Prod(pCtx, pMap);
	}
	return JX9_OK;
}